

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnicodeString.cpp
# Opt level: O2

EStatusCode __thiscall
UnicodeString::FromUTF16LE(UnicodeString *this,uchar *inString,unsigned_long inLength)

{
  ulong uVar1;
  ushort uVar2;
  EStatusCode EVar3;
  ulong in_RAX;
  Trace *this_00;
  char *inFormat;
  ulong uVar4;
  ulong local_38;
  
  local_38 = in_RAX;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::clear
            (&this->mUnicodeCharacters);
  if ((inLength & 1) == 0) {
    for (uVar4 = 0; uVar4 < inLength - 1; uVar4 = uVar4 + 2) {
      uVar2 = CONCAT11(inString[uVar4 + 1],inString[uVar4]);
      if ((inString[uVar4 + 1] & 0xfc) == 0xd8) {
        uVar1 = uVar4 + 2;
        if ((inLength - 1 <= uVar1) || ((inString[uVar4 + 3] & 0xfc) != 0xdc)) {
          this_00 = Trace::DefaultTrace();
          inFormat = 
          "UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate"
          ;
          goto LAB_001bd603;
        }
        local_38 = (ulong)((uint)uVar2 * 0x400 + (uint)CONCAT11(inString[uVar4 + 3],inString[uVar1])
                          + 0xfca02400);
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->mUnicodeCharacters,&local_38);
        uVar4 = uVar1;
      }
      else {
        local_38 = (ulong)uVar2;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&this->mUnicodeCharacters,&local_38);
      }
    }
    EVar3 = eSuccess;
  }
  else {
    this_00 = Trace::DefaultTrace();
    inFormat = "UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters";
LAB_001bd603:
    Trace::TraceToLog(this_00,inFormat);
    EVar3 = eFailure;
  }
  return EVar3;
}

Assistant:

EStatusCode UnicodeString::FromUTF16LE(const unsigned char* inString, unsigned long inLength)
{
	mUnicodeCharacters.clear();
	EStatusCode status = PDFHummus::eSuccess;

	if(inLength % 2 != 0)
	{
		TRACE_LOG("UnicodeString::FromUTF16LE, invalid UTF16 string, has odd numbers of characters");
		return PDFHummus::eFailure;
	}

	for(unsigned long i = 0; i < inLength-1 && PDFHummus::eSuccess == status; i+=2)
	{
		unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];

		if(0xD800 <= buffer && buffer <= 0xDBFF) 
		{
			// Aha! high surrogate! this means that this character requires 2 w_chars
			unsigned short highSurrogate = buffer;
			i+=2;
			if(i>=inLength-1)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short buffer = (((unsigned short)inString[i+1])<<8) + inString[i];
			if(0xDC00 > buffer|| buffer > 0xDFFF)
			{
				TRACE_LOG("UnicodeString::FromUTF16LE, fault string - high surrogat encountered without a low surrogate");
				status = PDFHummus::eFailure;
				break;
			}

			unsigned short lowSurrogate = buffer;

			mUnicodeCharacters.push_back(0x10000 + ((highSurrogate - 0xD800) << 10) + (lowSurrogate - 0xDC00));
		}
		else
			mUnicodeCharacters.push_back(buffer);		
	}

	return status;
}